

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

void duckdb_hll::sdsupdatelen(sds s)

{
  size_t newlen;
  
  newlen = strlen(s);
  sdssetlen(s,newlen);
  return;
}

Assistant:

void sdsupdatelen(sds s) {
    size_t reallen = strlen(s);
    sdssetlen(s, reallen);
}